

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O2

size_t io::net::write<io::posix::file,io::net::const_buffer,io::net::transfer_all,void>
                 (file *stream,const_buffer *buffers,error_code *param_3)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  
  std::error_code::clear(param_3);
  uVar1 = buffers->size_;
  bVar4 = true;
  for (uVar3 = 0; (bVar4 && (uVar3 < uVar1)); uVar3 = uVar3 + sVar2) {
    sVar2 = posix::file::write_some(stream,buffers,param_3);
    bVar4 = param_3->_M_value == 0;
  }
  return uVar3;
}

Assistant:

std::size_t write(SyncWriteStream& stream,
                  const ConstBufferSequence& buffers,
                  CompletionCondition completion_condition,
                  std::error_code& ec)
{
    ec.clear();

    std::size_t total_bytes_written = 0;
    std::size_t next_write_size = max_single_transfer_size;
    std::size_t buf_size = buffer_size(buffers);

    while (total_bytes_written < buf_size && next_write_size != 0) {
        total_bytes_written += stream.write_some(buffers, ec);
        next_write_size = completion_condition(ec, total_bytes_written);
    }

    return total_bytes_written;
}